

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

int NeedWriter(FFSArrayRequest_conflict Req,int i)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  bool local_51;
  size_t RankSize;
  size_t RankOffset;
  size_t SelSize;
  size_t SelOffset;
  int j;
  size_t NodeLast;
  size_t NodeFirst;
  int i_local;
  FFSArrayRequest_conflict Req_local;
  uint local_4;
  
  if (Req->RequestType == Local) {
    uVar1 = Req->VarRec->PerWriterBlockStart[i];
    local_51 = false;
    if (uVar1 <= Req->BlockID) {
      local_51 = Req->BlockID <= (Req->VarRec->PerWriterBlockCount[i] + uVar1) - 1;
    }
    local_4 = (uint)local_51;
  }
  else {
    for (j = 0; (ulong)(long)j < Req->VarRec->DimCount; j = j + 1) {
      uVar1 = Req->Start[j];
      if (Req->VarRec->PerWriterStart[i] == (size_t *)0x0) {
        return 0;
      }
      uVar2 = Req->VarRec->PerWriterStart[i][j];
      sVar3 = Req->VarRec->PerWriterCounts[i][j];
      if ((Req->Count[j] == 0) || (sVar3 == 0)) {
        return 0;
      }
      if (((uVar2 < uVar1) && (uVar2 + sVar3 <= uVar1)) || (uVar1 + Req->Count[j] <= uVar2)) {
        return 0;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int NeedWriter(FFSArrayRequest Req, int i)
{
    if (Req->RequestType == Local)
    {
        size_t NodeFirst = Req->VarRec->PerWriterBlockStart[i];
        size_t NodeLast = Req->VarRec->PerWriterBlockCount[i] + NodeFirst - 1;
        return (NodeFirst <= Req->BlockID) && (NodeLast >= Req->BlockID);
    }
    // else Global case
    for (int j = 0; j < Req->VarRec->DimCount; j++)
    {
        size_t SelOffset = Req->Start[j];
        size_t SelSize = Req->Count[j];
        size_t RankOffset;
        size_t RankSize;
        if (Req->VarRec->PerWriterStart[i] == NULL)
        /* this writer didn't write */
        {
            return 0;
        }
        RankOffset = Req->VarRec->PerWriterStart[i][j];
        RankSize = Req->VarRec->PerWriterCounts[i][j];
        if ((SelSize == 0) || (RankSize == 0))
        {
            return 0;
        }
        if ((RankOffset < SelOffset && (RankOffset + RankSize) <= SelOffset) ||
            (RankOffset >= SelOffset + SelSize))
        {
            return 0;
        }
    }
    return 1;
}